

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O0

bool cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(string *platform)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a1;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a0;
  undefined1 local_9f;
  allocator<char> local_9e;
  allocator<char> local_9d [20];
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  string *platform_local;
  
  local_10 = (undefined1  [8])platform;
  if (PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
      supportedPlatforms_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
                                 supportedPlatforms_abi_cxx11_);
    if (iVar1 != 0) {
      local_9f = 1;
      local_88 = &local_80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Windows",&local_89);
      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_60,"Linux",local_9d);
      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_40,"Darwin",&local_9e);
      local_9f = 0;
      local_20 = &local_80;
      local_18 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_a1);
      __l._M_len = local_18;
      __l._M_array = local_20;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
             supportedPlatforms_abi_cxx11_,__l,&local_a0,&local_a1);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_a1);
      local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
      do {
        local_e8 = local_e8 + -1;
        std::__cxx11::string::~string((string *)local_e8);
      } while (local_e8 != &local_80);
      std::allocator<char>::~allocator(&local_9e);
      std::allocator<char>::~allocator(local_9d);
      std::allocator<char>::~allocator(&local_89);
      __cxa_atexit(std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
                           supportedPlatforms_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
                           supportedPlatforms_abi_cxx11_);
    }
  }
  sVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
                   supportedPlatforms_abi_cxx11_,(key_type *)local_10);
  return sVar2 != 0;
}

Assistant:

bool cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(
  const std::string& platform)
{
  static const std::set<std::string> supportedPlatforms = { "Windows", "Linux",
                                                            "Darwin" };
  return supportedPlatforms.count(platform);
}